

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceBlock
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  ErrorMaker local_60;
  string_view local_50;
  string_view local_40;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *service_location_local;
  ServiceDescriptorProto *service_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)service_location;
  service_location_local = (LocationRecorder *)service;
  service_local = (ServiceDescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"{");
  bVar1 = ConsumeEndOfDeclaration(this,local_40,(LocationRecorder *)containing_file_local);
  if (bVar1) {
    while( true ) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"}");
      bVar1 = TryConsumeEndOfDeclaration(this,local_50,(LocationRecorder *)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bVar1 = AtEnd(this);
      if (bVar1) {
        ErrorMaker::ErrorMaker
                  (&local_60,"Reached end of input in service definition (missing \'}\').");
        RecordError(this,local_60);
        return false;
      }
      bVar1 = ParseServiceStatement
                        (this,(ServiceDescriptorProto *)service_location_local,
                         (LocationRecorder *)containing_file_local,local_30);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseServiceBlock(ServiceDescriptorProto* service,
                               const LocationRecorder& service_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &service_location));

  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in service definition (missing '}').");
      return false;
    }

    if (!ParseServiceStatement(service, service_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}